

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ay_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Ay_Emu::run_clocks(Ay_Emu *this,blip_time_t *duration,int param_2)

{
  state_t *psVar1;
  int iVar2;
  long lVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  
  psVar1 = (this->super_Ay_Cpu).state;
  iVar2 = psVar1->base;
  iVar5 = -iVar2;
  psVar1->time = iVar5;
  iVar6 = *duration;
  if (this->cpc_mode == false && this->spectrum_mode == false) {
    iVar6 = iVar6 / 2;
    *duration = iVar6;
    iVar2 = psVar1->base;
    iVar5 = psVar1->time;
  }
  iVar2 = iVar2 + iVar5;
  if (iVar2 < iVar6) {
    iVar5 = this->next_play;
    do {
      if (iVar6 < iVar5) {
        iVar5 = iVar6;
      }
      Ay_Cpu::run(&this->super_Ay_Cpu,iVar5);
      psVar1 = (this->super_Ay_Cpu).state;
      iVar2 = psVar1->time;
      iVar5 = this->next_play;
      if (iVar5 <= psVar1->base + iVar2) {
        iVar5 = iVar5 + this->play_period;
        this->next_play = iVar5;
        if ((this->super_Ay_Cpu).r.iff1 != '\0') {
          uVar4 = (this->super_Ay_Cpu).r.pc;
          iVar2 = (uint)((this->mem).ram[uVar4] == 'v') + (uint)uVar4;
          (this->super_Ay_Cpu).r.iff1 = '\0';
          (this->super_Ay_Cpu).r.iff2 = '\0';
          uVar4 = (this->super_Ay_Cpu).r.sp;
          (this->mem).ram[uVar4 - 1 & 0xffff] = (byte)((uint)iVar2 >> 8);
          uVar4 = uVar4 - 2;
          (this->super_Ay_Cpu).r.sp = uVar4;
          (this->mem).ram[uVar4] = (byte)iVar2;
          (this->super_Ay_Cpu).r.pc = 0x38;
          iVar6 = psVar1->time;
          iVar2 = iVar6 + 0xc;
          psVar1->time = iVar2;
          if ((this->super_Ay_Cpu).r.im == '\x02') {
            iVar2 = iVar6 + 0x12;
            psVar1->time = iVar2;
            lVar3 = (ulong)(this->super_Ay_Cpu).r.i * 0x100;
            (this->super_Ay_Cpu).r.pc =
                 CONCAT11((this->mem).ram[(int)lVar3 + 0x100U & 0xffff],
                          (this->mem).ram[lVar3 + 0xff]);
          }
        }
      }
      iVar2 = iVar2 + psVar1->base;
      iVar6 = *duration;
    } while (iVar2 < iVar6);
  }
  *duration = iVar2;
  this->next_play = this->next_play - iVar2;
  psVar1->time = psVar1->time - *duration;
  iVar2 = *duration;
  iVar6 = (this->apu).last_time;
  if (iVar6 < iVar2) {
    Ay_Apu::run_until(&this->apu,iVar2);
    iVar6 = (this->apu).last_time;
  }
  (this->apu).last_time = iVar6 - iVar2;
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Ay_Emu::run_clocks( blip_time_t& duration, int )
{
	set_time( 0 );
	if ( !(spectrum_mode | cpc_mode) )
		duration /= 2; // until mode is set, leave room for halved clock rate
	
	while ( time() < duration )
	{
		cpu::run( min( duration, (blip_time_t) next_play ) );
		
		if ( time() >= next_play )
		{
			next_play += play_period;
			
			if ( r.iff1 )
			{
				if ( mem.ram [r.pc] == 0x76 )
					r.pc++;
				
				r.iff1 = r.iff2 = 0;
				
				mem.ram [--r.sp] = uint8_t (r.pc >> 8);
				mem.ram [--r.sp] = uint8_t (r.pc);
				r.pc = 0x38;
				cpu::adjust_time( 12 );
				if ( r.im == 2 )
				{
					cpu::adjust_time( 6 );
					unsigned addr = r.i * 0x100u + 0xFF;
					r.pc = mem.ram [(addr + 1) & 0xFFFF] * 0x100u + mem.ram [addr];
				}
			}
		}
	}
	duration = time();
	next_play -= duration;
	check( next_play >= 0 );
	adjust_time( -duration );
	
	apu.end_frame( duration );
	
	return 0;
}